

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::Q_from_Vect_to_Vect
          (ChQuaternion<double> *__return_storage_ptr__,ChVector<double> *fr_vect,
          ChVector<double> *to_vect)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 local_40 [16];
  undefined8 local_30;
  undefined1 extraout_var [56];
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = fr_vect->m_data[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = fr_vect->m_data[1] * fr_vect->m_data[1];
  auVar11 = vfmadd231sd_fma(auVar28,auVar11,auVar11);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = fr_vect->m_data[2];
  auVar11 = vfmadd213sd_fma(auVar18,auVar18,auVar11);
  if (auVar11._0_8_ < 0.0) {
    dVar16 = sqrt(auVar11._0_8_);
  }
  else {
    auVar11 = vsqrtsd_avx(auVar11,auVar11);
    dVar16 = auVar11._0_8_;
  }
  auVar19._8_8_ = 0;
  auVar19._0_8_ = to_vect->m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = to_vect->m_data[1] * to_vect->m_data[1];
  auVar11 = vfmadd231sd_fma(auVar29,auVar19,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = to_vect->m_data[2];
  auVar11 = vfmadd213sd_fma(auVar20,auVar20,auVar11);
  if (auVar11._0_8_ < 0.0) {
    dVar15 = sqrt(auVar11._0_8_);
  }
  else {
    auVar11 = vsqrtsd_avx(auVar11,auVar11);
    dVar15 = auVar11._0_8_;
  }
  auVar21._8_8_ = 0;
  auVar21._0_8_ = fr_vect->m_data[0];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = fr_vect->m_data[1];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = to_vect->m_data[2];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = fr_vect->m_data[2];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = to_vect->m_data[0];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = to_vect->m_data[1];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = to_vect->m_data[1] * fr_vect->m_data[2];
  auVar18 = vfmsub231sd_fma(auVar57,auVar30,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = to_vect->m_data[2] * fr_vect->m_data[0];
  auVar11 = vfmsub231sd_fma(auVar35,auVar45,auVar41);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = to_vect->m_data[0] * fr_vect->m_data[1];
  auVar28 = vfmsub231sd_fma(auVar31,auVar21,auVar51);
  dVar17 = auVar11._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar17 * dVar17;
  auVar11 = vfmadd231sd_fma(auVar59,auVar18,auVar18);
  auVar60 = vfmadd231sd_fma(auVar11,auVar28,auVar28);
  if (auVar60._0_8_ < 0.0) {
    auVar27._0_8_ = sqrt(auVar60._0_8_);
    auVar27._8_56_ = extraout_var;
    auVar11 = auVar27._0_16_;
    auVar60._8_8_ = 0;
  }
  else {
    auVar11 = vsqrtsd_avx(auVar60,auVar60);
  }
  auVar46._0_8_ = auVar11._0_8_ / (dVar16 * dVar15);
  auVar46._8_8_ = auVar11._8_8_;
  bVar5 = auVar46._0_8_ < -1.0;
  auVar20 = ZEXT816(0x3ff0000000000000);
  dVar15 = 1.0 / (dVar16 * dVar15);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = fr_vect->m_data[0];
  dVar16 = fr_vect->m_data[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar16;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar15 * to_vect->m_data[0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar15 * to_vect->m_data[1] * dVar16;
  auVar11 = vfmadd231sd_fma(auVar42,auVar22,auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = fr_vect->m_data[2];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar15 * to_vect->m_data[2];
  auVar19 = vfmadd231sd_fma(auVar11,auVar37,auVar52);
  auVar11 = vminsd_avx(auVar20,auVar19);
  uVar2 = vcmpsd_avx512f(auVar19,ZEXT816(0xbff0000000000000),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  dVar15 = (double)((ulong)bVar3 * -0x4010000000000000 + (ulong)!bVar3 * auVar11._0_8_);
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  auVar11 = vandpd_avx512vl(auVar46,auVar4);
  uVar2 = vcmpsd_avx512f(auVar20,auVar46,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  dVar10 = (double)((ulong)bVar5 * 0x3ff0000000000000 +
                   (ulong)!bVar5 *
                   ((ulong)bVar3 * 0x3ff0000000000000 + (ulong)!bVar3 * auVar11._0_8_));
  if (((dVar10 != 0.0) || (NAN(dVar10))) || (dVar15 <= 0.0)) {
    if ((1e-06 <= dVar10) || (0.0 <= dVar15)) {
      auVar11 = vminsd_avx(auVar20,auVar46);
      if (auVar60._0_8_ < 0.0) {
        dVar16 = sqrt(auVar60._0_8_);
      }
      else {
        auVar19 = vsqrtsd_avx(auVar60,auVar60);
        dVar16 = auVar19._0_8_;
      }
      bVar3 = 2.2250738585072014e-308 <= dVar16;
      dVar16 = 1.0 / dVar16;
      dVar15 = ChAtan2(dVar15,(double)((ulong)bVar5 * -0x4010000000000000 +
                                      (ulong)!bVar5 * auVar11._0_8_));
      dVar10 = sin(dVar15 * 0.5);
      dVar15 = cos(dVar15 * 0.5);
      __return_storage_ptr__->m_data[0] = dVar15;
      __return_storage_ptr__->m_data[1] =
           dVar10 * (double)((ulong)bVar3 * (long)(dVar16 * auVar18._0_8_) +
                            (ulong)!bVar3 * 0x3ff0000000000000);
      __return_storage_ptr__->m_data[2] = dVar10 * (double)((ulong)bVar3 * (long)(dVar16 * dVar17));
      __return_storage_ptr__->m_data[3] =
           dVar10 * (double)((ulong)bVar3 * (long)(dVar16 * auVar28._0_8_));
    }
    else {
      auVar61._8_8_ = 0x7fffffffffffffff;
      auVar61._0_8_ = 0x7fffffffffffffff;
      auVar11 = vandpd_avx(auVar61,auVar22);
      auVar18 = vandpd_avx(auVar61,auVar32);
      bVar3 = auVar11._0_8_ < auVar18._0_8_;
      uVar6 = (ulong)bVar3;
      auVar18 = vandpd_avx(auVar61,auVar37);
      if ((double)((ulong)bVar3 * (long)dVar16 + (ulong)!bVar3 * (long)auVar11._0_8_) <
          auVar18._0_8_) {
        uVar6 = 2;
      }
      uVar7 = (int)uVar6 + 1;
      uVar9 = 0;
      uVar8 = (ulong)uVar7;
      if (uVar7 == 3) {
        uVar8 = uVar9;
      }
      auVar47._8_8_ = 0;
      auVar47._0_8_ = fr_vect->m_data[uVar8];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = fr_vect->m_data[uVar6];
      auVar58._8_8_ = 0;
      auVar58._0_8_ = fr_vect->m_data[(int)uVar8 + 1 + (((int)uVar8 + 1U) / 3) * -3];
      auVar63._8_8_ = 0;
      auVar63._0_8_ = fr_vect->m_data[uVar6] * fr_vect->m_data[2];
      auVar28 = vfmsub231sd_fma(auVar63,auVar32,auVar58);
      auVar64._8_8_ = 0;
      auVar64._0_8_ =
           fr_vect->m_data[(int)uVar8 + 1 + (((int)uVar8 + 1U) / 3) * -3] * fr_vect->m_data[0];
      auVar18 = vfnmsub231sd_fma(auVar64,auVar47,auVar37);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar16 * fr_vect->m_data[uVar8];
      auVar11 = vfmadd231sd_fma(auVar48,auVar22,auVar53);
      dVar16 = auVar18._0_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar16 * dVar16;
      auVar18 = vfmadd231sd_fma(auVar23,auVar28,auVar28);
      auVar18 = vfmadd231sd_fma(auVar18,auVar11,auVar11);
      if (auVar18._0_8_ < 0.0) {
        dVar15 = sqrt(auVar18._0_8_);
      }
      else {
        auVar18 = vsqrtsd_avx(auVar18,auVar18);
        dVar15 = auVar18._0_8_;
      }
      bVar3 = 2.2250738585072014e-308 <= dVar15;
      dVar15 = 1.0 / dVar15;
      dVar17 = to_vect->m_data[0];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar17;
      dVar10 = to_vect->m_data[1];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar10;
      auVar43._0_8_ = -dVar17;
      auVar43._8_8_ = 0x8000000000000000;
      auVar49._0_8_ = -dVar10;
      auVar49._8_8_ = 0x8000000000000000;
      dVar1 = to_vect->m_data[2];
      auVar54._8_8_ = 0;
      auVar54._0_8_ = dVar1;
      auVar38._0_8_ = -dVar1;
      auVar38._8_8_ = 0x8000000000000000;
      local_40 = vunpcklpd_avx(auVar43,auVar49);
      local_30 = vmovlpd_avx(auVar38);
      auVar18 = vandpd_avx(auVar61,auVar24);
      auVar19 = vandpd_avx(auVar61,auVar33);
      bVar5 = auVar18._0_8_ < auVar19._0_8_;
      auVar19 = vandpd_avx(auVar61,auVar54);
      uVar6 = 2;
      if (auVar19._0_8_ <=
          (double)((ulong)bVar5 * (long)auVar49._0_8_ + (ulong)!bVar5 * (long)auVar18._0_8_)) {
        uVar6 = (ulong)bVar5;
      }
      uVar7 = (int)uVar6 + 1;
      if (uVar7 != 3) {
        uVar9 = (ulong)uVar7;
      }
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(double *)(local_40 + uVar9 * 8);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(double *)(local_40 + uVar6 * 8);
      auVar50._8_8_ = 0;
      auVar50._0_8_ =
           *(double *)(local_40 + (ulong)((int)uVar9 + 1 + (((int)uVar9 + 1U) / 3) * -3) * 8);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = dVar1 * *(double *)(local_40 + uVar6 * 8);
      auVar19 = vfnmadd231sd_fma(auVar62,auVar33,auVar50);
      auVar65._8_8_ = 0;
      auVar65._0_8_ =
           dVar17 * *(double *)
                     (local_40 + (ulong)((int)uVar9 + 1 + (((int)uVar9 + 1U) / 3) * -3) * 8);
      auVar18 = vfmadd231sd_fma(auVar65,auVar39,auVar54);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(double *)(local_40 + uVar9 * 8) * dVar10;
      auVar20 = vfnmsub231sd_fma(auVar55,auVar24,auVar44);
      dVar17 = auVar18._0_8_;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar17 * dVar17;
      auVar18 = vfmadd231sd_fma(auVar25,auVar19,auVar19);
      auVar18 = vfmadd231sd_fma(auVar18,auVar20,auVar20);
      if (auVar18._0_8_ < 0.0) {
        dVar10 = sqrt(auVar18._0_8_);
      }
      else {
        auVar18 = vsqrtsd_avx(auVar18,auVar18);
        dVar10 = auVar18._0_8_;
      }
      bVar5 = 2.2250738585072014e-308 <= dVar10;
      dVar10 = 1.0 / dVar10;
      dVar1 = (double)((ulong)bVar3 * (long)(auVar28._0_8_ * dVar15) +
                      (ulong)!bVar3 * 0x3ff0000000000000) +
              (double)((ulong)bVar5 * (long)(auVar19._0_8_ * dVar10) +
                      (ulong)!bVar5 * 0x3ff0000000000000);
      dVar16 = (double)((ulong)bVar3 * (long)(dVar16 * dVar15)) +
               (double)((ulong)bVar5 * (long)(dVar17 * dVar10));
      dVar15 = (double)((ulong)bVar3 * (long)(auVar11._0_8_ * dVar15)) +
               (double)((ulong)bVar5 * (long)(auVar20._0_8_ * dVar10));
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar16 * dVar16;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar1;
      auVar11 = vfmadd231sd_fma(auVar26,auVar40,auVar40);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = dVar15;
      auVar11 = vfmadd231sd_fma(auVar11,auVar56,auVar56);
      if (auVar11._0_8_ < 0.0) {
        dVar17 = sqrt(auVar11._0_8_);
      }
      else {
        auVar11 = vsqrtsd_avx(auVar11,auVar11);
        dVar17 = auVar11._0_8_;
      }
      auVar28 = ZEXT816(0x3ff0000000000000);
      auVar18 = ZEXT816(0xbff0000000000000);
      bVar3 = 2.2250738585072014e-308 <= dVar17;
      dVar17 = 1.0 / dVar17;
      auVar12._0_8_ = (ulong)bVar3 * (long)(dVar17 * dVar1) + (ulong)!bVar3 * 0x3ff0000000000000;
      auVar12._8_8_ = 0;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (ulong)bVar3 * (long)(dVar17 * dVar16);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (ulong)bVar3 * (long)(dVar17 * dVar15);
      __return_storage_ptr__->m_data[0] = 0.0;
      auVar11 = vminsd_avx(auVar28,auVar12);
      uVar2 = vcmpsd_avx512f(auVar12,auVar18,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      __return_storage_ptr__->m_data[1] =
           (double)((ulong)bVar3 * -0x4010000000000000 + (ulong)!bVar3 * auVar11._0_8_);
      auVar11 = vminsd_avx(auVar28,auVar13);
      uVar2 = vcmpsd_avx512f(auVar13,auVar18,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      __return_storage_ptr__->m_data[2] =
           (double)((ulong)bVar3 * -0x4010000000000000 + (ulong)!bVar3 * auVar11._0_8_);
      auVar11 = vminsd_avx(auVar28,auVar14);
      uVar2 = vcmpsd_avx512f(auVar14,auVar18,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      __return_storage_ptr__->m_data[3] =
           (double)((ulong)bVar3 * -0x4010000000000000 + (ulong)!bVar3 * auVar11._0_8_);
    }
  }
  else {
    __return_storage_ptr__->m_data[0] = 1.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[3] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Q_from_Vect_to_Vect(const ChVector<double>& fr_vect, const ChVector<double>& to_vect) {
    const double ANGLE_TOLERANCE = 1e-6;
    ChQuaternion<double> quat;
    double halfang;
    double sinhalf;
    ChVector<double> axis;

    double lenXlen = fr_vect.Length() * to_vect.Length();
    axis = fr_vect % to_vect;
    double sinangle = ChClamp(axis.Length() / lenXlen, -1.0, +1.0);
    double cosangle = ChClamp(fr_vect ^ to_vect / lenXlen, -1.0, +1.0);

    // Consider three cases: Parallel, Opposite, non-collinear
    if (std::abs(sinangle) == 0.0 && cosangle > 0) {
        // fr_vect & to_vect are parallel
        quat.e0() = 1.0;
        quat.e1() = 0.0;
        quat.e2() = 0.0;
        quat.e3() = 0.0;
    } else if (std::abs(sinangle) < ANGLE_TOLERANCE && cosangle < 0) {
        // fr_vect & to_vect are opposite, i.e. ~180 deg apart
        axis = fr_vect.GetOrthogonalVector() + (-to_vect).GetOrthogonalVector();
        axis.Normalize();
        quat.e0() = 0.0;
        quat.e1() = ChClamp(axis.x(), -1.0, +1.0);
        quat.e2() = ChClamp(axis.y(), -1.0, +1.0);
        quat.e3() = ChClamp(axis.z(), -1.0, +1.0);
    } else {
        // fr_vect & to_vect are not co-linear case
        axis.Normalize();
        halfang = 0.5 * ChAtan2(cosangle, sinangle);
        sinhalf = sin(halfang);

        quat.e0() = cos(halfang);
        quat.e1() = sinhalf* axis.x();
        quat.e2() = sinhalf* axis.y();
        quat.e3() = sinhalf* axis.z();
    }
    return (quat);
}